

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O1

Status __thiscall
osqp::OsqpSolver::UpdateObjectiveMatrix
          (OsqpSolver *this,SparseMatrix<double,_0,_long_long> *objective_matrix)

{
  bool bVar1;
  SparseMatrix<double,_0,_long_long> *in_RDX;
  SparseMatrix<double,_0,_long_long> objective_matrix_upper_triangle;
  SparseMatrix<double,_0,_long_long> local_70;
  TriangularView<const_Eigen::SparseMatrix<double,_0,_long_long>,_2U> local_28;
  
  bVar1 = anon_unknown_6::IsUpperTriangular(in_RDX);
  if (bVar1) {
    anon_unknown_6::UpdateUpperTriangularObjectiveMatrix
              ((anon_unknown_6 *)this,in_RDX,*(OSQPWorkspaceHelper **)objective_matrix);
  }
  else {
    local_28.
    super_TriangularViewImpl<const_Eigen::SparseMatrix<double,_0,_long_long>,_2U,_Eigen::Sparse>.
    super_SparseMatrixBase<Eigen::TriangularView<const_Eigen::SparseMatrix<double,_0,_long_long>,_2U>_>
    .m_isRValue = (SparseMatrixBase<Eigen::TriangularView<const_Eigen::SparseMatrix<double,_0,_long_long>,_2U>_>
                   )false;
    local_70.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_long_long>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_long_long>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_long_long>_>)false;
    local_70.m_outerSize = 0;
    local_70.m_innerSize = 0;
    local_70.m_outerIndex = (StorageIndex *)0x0;
    local_70.m_innerNonZeros = (StorageIndex *)0x0;
    local_70.m_data.m_values = (Scalar *)0x0;
    local_70.m_data.m_indices = (StorageIndex *)0x0;
    local_70.m_data.m_size = 0;
    local_70.m_data.m_allocatedSize = 0;
    Eigen::internal::
    assign_sparse_to_sparse<Eigen::SparseMatrix<double,0,long_long>,Eigen::TriangularView<Eigen::SparseMatrix<double,0,long_long>const,2u>>
              (&local_70,&local_28);
    anon_unknown_6::UpdateUpperTriangularObjectiveMatrix
              ((anon_unknown_6 *)this,&local_70,*(OSQPWorkspaceHelper **)objective_matrix);
    free(local_70.m_outerIndex);
    free(local_70.m_innerNonZeros);
    Eigen::internal::CompressedStorage<double,_long_long>::~CompressedStorage(&local_70.m_data);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status OsqpSolver::UpdateObjectiveMatrix(
    const Eigen::SparseMatrix<double, Eigen::ColMajor, c_int>&
        objective_matrix) {
  // If the objective matrix is already upper triangular, we can skip the
  // temporary.
  if (IsUpperTriangular(objective_matrix)) {
    return UpdateUpperTriangularObjectiveMatrix(objective_matrix,
                                                workspace_.get());
  }

  // If not upper triangular, make a temporary.
  Eigen::SparseMatrix<double, Eigen::ColMajor, c_int>
      objective_matrix_upper_triangle =
          objective_matrix.triangularView<Eigen::Upper>();
  return UpdateUpperTriangularObjectiveMatrix(objective_matrix_upper_triangle,
                                              workspace_.get());
}